

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfo * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
          *this,PrimRef *prims,BBox1f *time_range,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  BBox1f BVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  undefined4 uVar12;
  BBox3fa *pBVar13;
  ulong uVar14;
  ulong uVar15;
  anon_class_16_2_07cfa4d6 *paVar16;
  ulong uVar17;
  long lVar18;
  size_t itime;
  uint uVar19;
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar40;
  float fVar41;
  undefined1 auVar37 [16];
  float fVar42;
  undefined1 auVar38 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar39;
  float fVar46;
  float fVar47;
  undefined1 auVar43 [16];
  float fVar48;
  undefined1 auVar44 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar45;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  size_t local_198;
  size_t local_170;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  ulong local_110;
  anon_class_16_2_07cfa4d6 local_108;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_f8;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_d8;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  local_138._8_8_ = 0x7f8000007f800000;
  local_138._0_8_ = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  local_148._8_8_ = 0xff800000ff800000;
  local_148._0_8_ = 0xff800000ff800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  fVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
          super_Geometry.time_range.lower;
  fVar3 = time_range->lower;
  if (time_range->lower <= fVar2) {
    fVar3 = fVar2;
  }
  fVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
          super_Geometry.time_range.upper;
  if (time_range->upper <= fVar2) {
    fVar2 = time_range->upper;
  }
  if (fVar3 <= fVar2) {
    uVar15 = r->_begin;
    if (uVar15 < r->_end) {
      local_198 = 0;
      local_168._8_8_ = 0x7f8000007f800000;
      local_168._0_8_ = 0x7f8000007f800000;
      local_138._8_8_ = 0x7f8000007f800000;
      local_138._0_8_ = 0x7f8000007f800000;
      local_158._8_8_ = 0xff800000ff800000;
      local_158._0_8_ = 0xff800000ff800000;
      local_148._8_8_ = 0xff800000ff800000;
      local_148._0_8_ = 0xff800000ff800000;
      local_170 = k;
      do {
        BVar4 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                super_CurveGeometry.super_Geometry.time_range;
        auVar38._8_4_ = BVar4.lower;
        fVar36 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.super_Geometry.fnumTimeSegments;
        fVar26 = BVar4.upper - auVar38._8_4_;
        auVar38._4_4_ = floorf(((fVar3 - auVar38._8_4_) / fVar26) * 1.0000002 * fVar36);
        auVar38._0_4_ = ceilf(((fVar2 - auVar38._8_4_) / fVar26) * 0.99999976 * fVar36);
        uVar19 = *(uint *)(*(long *)&(this->
                                     super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                     super_CurveGeometry.super_Geometry.field_0x58 +
                          *(long *)&(this->
                                    super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                    super_CurveGeometry.field_0x68 * uVar15);
        uVar14 = (ulong)(uVar19 + 1);
        pBVar5 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.vertices.items;
        if (uVar14 < (pBVar5->super_RawBufferView).num) {
          fVar34 = 0.0;
          if (0.0 <= auVar38._4_4_) {
            fVar34 = auVar38._4_4_;
          }
          if (fVar36 <= auVar38._0_4_) {
            auVar38._0_4_ = fVar36;
          }
          if ((uint)(int)fVar34 <= (uint)(int)auVar38._0_4_) {
            uVar17 = (ulong)(int)fVar34;
            pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                     super_CurveGeometry.tangents.items;
            lVar18 = uVar17 * 0x38 + 0x10;
            paVar16 = &local_108;
            do {
              lVar7 = *(long *)((long)pBVar5 + lVar18 + -0x10);
              lVar8 = *(long *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar18);
              pfVar1 = (float *)(lVar7 + lVar8 * (ulong)uVar19);
              auVar32._4_4_ = -(uint)(pfVar1[1] <= -1.844e+18);
              auVar32._0_4_ = -(uint)(*pfVar1 <= -1.844e+18);
              auVar32._8_4_ = -(uint)(pfVar1[2] <= -1.844e+18);
              auVar32._12_4_ = -(uint)(pfVar1[3] <= -1.844e+18);
              auVar44._4_4_ = -(uint)(1.844e+18 <= pfVar1[1]);
              auVar44._0_4_ = -(uint)(1.844e+18 <= *pfVar1);
              auVar44._8_4_ = -(uint)(1.844e+18 <= pfVar1[2]);
              auVar44._12_4_ = -(uint)(1.844e+18 <= pfVar1[3]);
              iVar20 = movmskps((int)paVar16,auVar44 | auVar32);
              if (iVar20 != 0) goto LAB_009bd02b;
              pfVar1 = (float *)(lVar7 + lVar8 * uVar14);
              auVar28._4_4_ = -(uint)(pfVar1[1] <= -1.844e+18);
              auVar28._0_4_ = -(uint)(*pfVar1 <= -1.844e+18);
              auVar28._8_4_ = -(uint)(pfVar1[2] <= -1.844e+18);
              auVar28._12_4_ = -(uint)(pfVar1[3] <= -1.844e+18);
              auVar21._4_4_ = -(uint)(1.844e+18 <= pfVar1[1]);
              auVar21._0_4_ = -(uint)(1.844e+18 <= *pfVar1);
              auVar21._8_4_ = -(uint)(1.844e+18 <= pfVar1[2]);
              auVar21._12_4_ = -(uint)(1.844e+18 <= pfVar1[3]);
              iVar20 = movmskps((int)lVar7,auVar21 | auVar28);
              if (iVar20 != 0) goto LAB_009bd02b;
              lVar7 = *(long *)((long)pBVar6 + lVar18 + -0x10);
              lVar8 = *(long *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar18);
              pfVar1 = (float *)(lVar7 + lVar8 * (ulong)uVar19);
              auVar29._4_4_ = -(uint)(pfVar1[1] <= -1.844e+18);
              auVar29._0_4_ = -(uint)(*pfVar1 <= -1.844e+18);
              auVar29._8_4_ = -(uint)(pfVar1[2] <= -1.844e+18);
              auVar29._12_4_ = -(uint)(pfVar1[3] <= -1.844e+18);
              auVar22._4_4_ = -(uint)(1.844e+18 <= pfVar1[1]);
              auVar22._0_4_ = -(uint)(1.844e+18 <= *pfVar1);
              auVar22._8_4_ = -(uint)(1.844e+18 <= pfVar1[2]);
              auVar22._12_4_ = -(uint)(1.844e+18 <= pfVar1[3]);
              uVar11 = movmskps(0,auVar22 | auVar29);
              paVar16 = (anon_class_16_2_07cfa4d6 *)(ulong)uVar11;
              if (uVar11 != 0) goto LAB_009bd02b;
              pfVar1 = (float *)(lVar7 + lVar8 * uVar14);
              auVar30._4_4_ = -(uint)(pfVar1[1] <= -1.844e+18);
              auVar30._0_4_ = -(uint)(*pfVar1 <= -1.844e+18);
              auVar30._8_4_ = -(uint)(pfVar1[2] <= -1.844e+18);
              auVar30._12_4_ = -(uint)(pfVar1[3] <= -1.844e+18);
              auVar23._4_4_ = -(uint)(1.844e+18 <= pfVar1[1]);
              auVar23._0_4_ = -(uint)(1.844e+18 <= *pfVar1);
              auVar23._8_4_ = -(uint)(1.844e+18 <= pfVar1[2]);
              auVar23._12_4_ = -(uint)(1.844e+18 <= pfVar1[3]);
              iVar20 = movmskps((int)lVar7,auVar23 | auVar30);
              if (iVar20 != 0) goto LAB_009bd02b;
              uVar17 = uVar17 + 1;
              lVar18 = lVar18 + 0x38;
            } while (uVar17 <= (ulong)(long)(int)auVar38._0_4_);
          }
          local_108.primID = &local_110;
          fVar34 = (fVar3 - auVar38._8_4_) / fVar26;
          fVar26 = (fVar2 - auVar38._8_4_) / fVar26;
          auVar38._8_4_ = fVar36 * fVar26;
          local_110 = uVar15;
          local_108.this = this;
          auVar38._0_4_ = floorf(fVar36 * fVar34);
          auVar38._4_4_ = ceilf(auVar38._8_4_);
          uVar19 = (uint)auVar38._0_4_;
          if (auVar38._0_4_ <= 0.0) {
            auVar38._0_4_ = 0.0;
          }
          auVar27._12_4_ = auVar38._4_4_;
          if (fVar36 <= auVar38._4_4_) {
            auVar27._12_4_ = fVar36;
          }
          if ((int)uVar19 < 0) {
            uVar19 = 0xffffffff;
          }
          iVar20 = (int)fVar36 + 1;
          if ((int)auVar38._4_4_ < (int)fVar36 + 1) {
            iVar20 = (int)auVar38._4_4_;
          }
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_d8.field_1,&local_108,(long)(int)auVar38._0_4_);
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_f8.field_1,&local_108,(long)(int)auVar27._12_4_);
          auVar38._4_4_ = fVar36 * fVar34 - auVar38._0_4_;
          if (iVar20 - uVar19 == 1) {
            if (auVar38._4_4_ <= 0.0) {
              auVar38._4_4_ = 0.0;
            }
            fVar36 = 1.0 - auVar38._4_4_;
            auVar43._0_4_ = fVar36 * local_d8.m128[0] + auVar38._4_4_ * local_f8.m128[0];
            auVar43._4_4_ = fVar36 * local_d8.m128[1] + auVar38._4_4_ * local_f8.m128[1];
            auVar43._8_4_ = fVar36 * local_d8.m128[2] + auVar38._4_4_ * local_f8.m128[2];
            auVar43._12_4_ = fVar36 * local_d8.m128[3] + auVar38._4_4_ * local_f8.m128[3];
            auVar37._0_4_ = fVar36 * local_c8 + auVar38._4_4_ * local_e8;
            auVar37._4_4_ = fVar36 * fStack_c4 + auVar38._4_4_ * fStack_e4;
            auVar37._8_4_ = fVar36 * fStack_c0 + auVar38._4_4_ * fStack_e0;
            auVar37._12_4_ = fVar36 * fStack_bc + auVar38._4_4_ * fStack_dc;
            auVar27._12_4_ = auVar27._12_4_ - auVar38._8_4_;
            if (auVar27._12_4_ <= 0.0) {
              auVar27._12_4_ = 0.0;
            }
            fVar36 = 1.0 - auVar27._12_4_;
            auVar38._0_4_ = local_f8.m128[0] * fVar36 + local_d8.m128[0] * auVar27._12_4_;
            auVar38._4_4_ = local_f8.m128[1] * fVar36 + local_d8.m128[1] * auVar27._12_4_;
            auVar38._8_4_ = local_f8.m128[2] * fVar36 + local_d8.m128[2] * auVar27._12_4_;
            auVar38._12_4_ = local_f8.m128[3] * fVar36 + local_d8.m128[3] * auVar27._12_4_;
            auVar27._0_4_ = fVar36 * local_e8 + auVar27._12_4_ * local_c8;
            auVar27._4_4_ = fVar36 * fStack_e4 + auVar27._12_4_ * fStack_c4;
            auVar27._8_4_ = fVar36 * fStack_e0 + auVar27._12_4_ * fStack_c0;
            auVar27._12_4_ = fVar36 * fStack_dc + auVar27._12_4_ * fStack_bc;
            uVar11 = 1;
          }
          else {
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_58.field_1,&local_108,(long)((int)auVar38._0_4_ + 1));
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_78.field_1,&local_108,(long)((int)auVar27._12_4_ + -1));
            if (auVar38._4_4_ <= 0.0) {
              auVar38._4_4_ = 0.0;
            }
            auVar38._0_4_ = 1.0 - auVar38._4_4_;
            auVar43._0_4_ = local_d8.m128[0] * auVar38._0_4_ + local_58.m128[0] * auVar38._4_4_;
            auVar43._4_4_ = local_d8.m128[1] * auVar38._0_4_ + local_58.m128[1] * auVar38._4_4_;
            auVar43._8_4_ = local_d8.m128[2] * auVar38._0_4_ + local_58.m128[2] * auVar38._4_4_;
            auVar43._12_4_ = local_d8.m128[3] * auVar38._0_4_ + local_58.m128[3] * auVar38._4_4_;
            auVar37._0_4_ = auVar38._0_4_ * local_c8 + auVar38._4_4_ * local_48;
            auVar37._4_4_ = auVar38._0_4_ * fStack_c4 + auVar38._4_4_ * fStack_44;
            auVar37._8_4_ = auVar38._0_4_ * fStack_c0 + auVar38._4_4_ * fStack_40;
            auVar37._12_4_ = auVar38._0_4_ * fStack_bc + auVar38._4_4_ * fStack_3c;
            auVar27._12_4_ = auVar27._12_4_ - auVar38._8_4_;
            if (auVar27._12_4_ <= 0.0) {
              auVar27._12_4_ = 0.0;
            }
            fVar35 = 1.0 - auVar27._12_4_;
            auVar38._0_4_ = local_f8.m128[0] * fVar35 + local_78.m128[0] * auVar27._12_4_;
            auVar38._4_4_ = local_f8.m128[1] * fVar35 + local_78.m128[1] * auVar27._12_4_;
            auVar38._8_4_ = local_f8.m128[2] * fVar35 + local_78.m128[2] * auVar27._12_4_;
            auVar38._12_4_ = local_f8.m128[3] * fVar35 + local_78.m128[3] * auVar27._12_4_;
            auVar27._0_4_ = fVar35 * local_e8 + auVar27._12_4_ * local_68;
            auVar27._4_4_ = fVar35 * fStack_e4 + auVar27._12_4_ * fStack_64;
            auVar27._8_4_ = fVar35 * fStack_e0 + auVar27._12_4_ * fStack_60;
            auVar27._12_4_ = fVar35 * fStack_dc + auVar27._12_4_ * fStack_5c;
            uVar11 = uVar19 + 1;
            if ((int)uVar11 < iVar20) {
              itime = (size_t)uVar11;
              iVar20 = ~uVar19 + iVar20;
              do {
                fVar35 = ((float)(int)itime / fVar36 - fVar34) / (fVar26 - fVar34);
                fVar33 = 1.0 - fVar35;
                fVar46 = auVar43._4_4_;
                fVar47 = auVar43._8_4_;
                fVar48 = auVar43._12_4_;
                fVar40 = auVar37._4_4_;
                fVar41 = auVar37._8_4_;
                fVar42 = auVar37._12_4_;
                local_a8 = fVar33 * auVar37._0_4_ + fVar35 * auVar27._0_4_;
                fStack_a4 = fVar33 * fVar40 + fVar35 * auVar27._4_4_;
                fStack_a0 = fVar33 * fVar41 + fVar35 * auVar27._8_4_;
                fStack_9c = fVar33 * fVar42 + fVar35 * auVar27._12_4_;
                local_b8 = auVar38._0_4_;
                fStack_b4 = auVar38._4_4_;
                fStack_b0 = auVar38._8_4_;
                fStack_ac = auVar38._12_4_;
                pBVar13 = linearBounds::anon_class_16_2_07cfa4d6::operator()
                                    ((BBox3fa *)&local_98.field_1,&local_108,itime);
                uVar11 = (uint)pBVar13;
                auVar24._0_4_ = local_98.m128[0] - (auVar43._0_4_ * fVar33 + auVar38._0_4_ * fVar35)
                ;
                auVar24._4_4_ = local_98.m128[1] - (fVar46 * fVar33 + auVar38._4_4_ * fVar35);
                auVar24._8_4_ = local_98.m128[2] - (fVar47 * fVar33 + auVar38._8_4_ * fVar35);
                auVar24._12_4_ = local_98.m128[3] - (fVar48 * fVar33 + auVar38._12_4_ * fVar35);
                auVar31._0_4_ = local_88 - local_a8;
                auVar31._4_4_ = fStack_84 - fStack_a4;
                auVar31._8_4_ = fStack_80 - fStack_a0;
                auVar31._12_4_ = fStack_7c - fStack_9c;
                auVar44 = minps(auVar24,ZEXT816(0));
                auVar32 = maxps(auVar31,ZEXT816(0));
                auVar43._0_4_ = auVar43._0_4_ + auVar44._0_4_;
                auVar43._4_4_ = fVar46 + auVar44._4_4_;
                auVar43._8_4_ = fVar47 + auVar44._8_4_;
                auVar43._12_4_ = fVar48 + auVar44._12_4_;
                auVar38._0_4_ = auVar44._0_4_ + local_b8;
                auVar38._4_4_ = auVar44._4_4_ + fStack_b4;
                auVar38._8_4_ = auVar44._8_4_ + fStack_b0;
                auVar38._12_4_ = auVar44._12_4_ + fStack_ac;
                auVar37._0_4_ = auVar37._0_4_ + auVar32._0_4_;
                auVar37._4_4_ = fVar40 + auVar32._4_4_;
                auVar37._8_4_ = fVar41 + auVar32._8_4_;
                auVar37._12_4_ = fVar42 + auVar32._12_4_;
                auVar27._0_4_ = auVar32._0_4_ + auVar27._0_4_;
                auVar27._4_4_ = auVar32._4_4_ + auVar27._4_4_;
                auVar27._8_4_ = auVar32._8_4_ + auVar27._8_4_;
                auVar27._12_4_ = auVar32._12_4_ + auVar27._12_4_;
                itime = itime + 1;
                iVar20 = iVar20 + -1;
              } while (iVar20 != 0);
            }
            else {
            }
          }
          auVar9._4_4_ = -(uint)(auVar43._4_4_ <= auVar37._4_4_);
          auVar9._0_4_ = -(uint)(auVar43._0_4_ <= auVar37._0_4_);
          auVar9._8_4_ = -(uint)(auVar43._8_4_ <= auVar37._8_4_);
          auVar9._12_4_ = -(uint)(auVar43._12_4_ <= auVar37._12_4_);
          uVar12 = movmskps(uVar11,auVar9);
          if (((~(byte)uVar12 & 7) == 0) &&
             (auVar10._4_4_ = -(uint)(auVar38._4_4_ <= auVar27._4_4_),
             auVar10._0_4_ = -(uint)(auVar38._0_4_ <= auVar27._0_4_),
             auVar10._8_4_ = -(uint)(auVar38._8_4_ <= auVar27._8_4_),
             auVar10._12_4_ = -(uint)(auVar38._12_4_ <= auVar27._12_4_),
             uVar12 = movmskps(CONCAT31((int3)((uint)uVar12 >> 8),~(byte)uVar12),auVar10),
             (~(byte)uVar12 & 7) == 0)) {
            auVar44 = minps(auVar43,auVar38);
            auVar38 = maxps(auVar37,auVar27);
            aVar45._0_12_ = auVar44._0_12_;
            aVar45.m128[3] = (float)geomID;
            aVar39._0_12_ = auVar38._0_12_;
            aVar39.m128[3] = (float)uVar15;
            auVar25._0_4_ = auVar44._0_4_ + auVar38._0_4_;
            auVar25._4_4_ = auVar44._4_4_ + auVar38._4_4_;
            auVar25._8_4_ = auVar44._8_4_ + auVar38._8_4_;
            auVar25._12_4_ = (float)geomID + (float)uVar15;
            local_168 = minps(local_168,(undefined1  [16])aVar45);
            local_158 = maxps(local_158,(undefined1  [16])aVar39);
            local_138 = minps(local_138,auVar25);
            local_148 = maxps(local_148,auVar25);
            local_198 = local_198 + 1;
            prims[local_170].lower.field_0 = aVar45;
            prims[local_170].upper.field_0 = aVar39;
            local_170 = local_170 + 1;
          }
        }
LAB_009bd02b:
        uVar15 = uVar15 + 1;
      } while (uVar15 < r->_end);
    }
    else {
      local_198 = 0;
      local_158._8_8_ = 0xff800000ff800000;
      local_158._0_8_ = 0xff800000ff800000;
      local_168._8_8_ = 0x7f8000007f800000;
      local_168._0_8_ = 0x7f8000007f800000;
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_168._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_168._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_158._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_158._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_138._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = local_138._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_148._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = local_148._8_8_;
    __return_storage_ptr__->end = local_198;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(this->time_range, time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbounds = linearBounds(j,t0t1);
          if (lbounds.bounds0.empty() || lbounds.bounds1.empty()) continue; // checks oriented curves with invalid normals which cause NaNs here
          const PrimRef prim(lbounds.bounds(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }